

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

path * __thiscall ghc::filesystem::path::operator+=(path *this,path *x)

{
  format fmt;
  pointer pcVar1;
  path p;
  impl_string_type local_38;
  
  pcVar1 = (x->_path)._M_dataplus._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)&local_38,pcVar1,pcVar1 + (x->_path)._M_string_length);
  fmt = (format)pcVar1;
  postprocess_path_with_format(&local_38,fmt);
  postprocess_path_with_format(&local_38,fmt);
  std::__cxx11::string::_M_append((char *)this,(ulong)local_38._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return this;
}

Assistant:

GHC_INLINE path& path::operator+=(const path& x)
{
    return concat(x._path);
}